

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_aead128.c
# Opt level: O0

size_t ascon_aead128_encrypt_final
                 (ascon_aead_ctx_t *ctx,uint8_t *ciphertext,uint8_t *tag,size_t tag_len)

{
  byte bVar1;
  uint64_t uVar2;
  size_t in_RCX;
  uint8_t *in_RDX;
  ascon_aead_ctx_t *in_RSI;
  ascon_aead_ctx_t *in_RDI;
  size_t freshly_generated_ciphertext_len;
  
  if ((in_RDI->bufstate).flow_state != '\x05') {
    ascon_aead128_80pq_finalise_assoc_data((ascon_aead_ctx_t *)0x127830);
  }
  uVar2 = bigendian_decode_varlen((in_RDI->bufstate).buffer,(in_RDI->bufstate).buffer_len);
  (in_RDI->bufstate).sponge.x0 = uVar2 ^ (in_RDI->bufstate).sponge.x0;
  (in_RDI->bufstate).sponge.x0 =
       0x80L << ((in_RDI->bufstate).buffer_len * -8 + 0x38 & 0x3f) ^ (in_RDI->bufstate).sponge.x0;
  bigendian_encode_varlen
            ((uint8_t *)in_RSI,(in_RDI->bufstate).sponge.x0,(in_RDI->bufstate).buffer_len);
  bVar1 = (in_RDI->bufstate).buffer_len;
  (in_RDI->bufstate).sponge.x1 = in_RDI->k0 ^ (in_RDI->bufstate).sponge.x1;
  (in_RDI->bufstate).sponge.x2 = in_RDI->k1 ^ (in_RDI->bufstate).sponge.x2;
  ascon_permutation_12((ascon_sponge_t *)0x1278ec);
  (in_RDI->bufstate).sponge.x3 = in_RDI->k0 ^ (in_RDI->bufstate).sponge.x3;
  (in_RDI->bufstate).sponge.x4 = in_RDI->k1 ^ (in_RDI->bufstate).sponge.x4;
  ascon_aead_generate_tag(in_RSI,in_RDX,in_RCX);
  ascon_aead_cleanup(in_RDI);
  return (ulong)bVar1;
}

Assistant:

ASCON_API size_t
ascon_aead128_encrypt_final(ascon_aead_ctx_t* const ctx,
                            uint8_t* const ciphertext,
                            uint8_t* tag,
                            size_t tag_len)
{
    ASCON_ASSERT(ctx != NULL);
    ASCON_ASSERT(ciphertext != NULL);
    ASCON_ASSERT(tag_len == 0 || tag != NULL);
    ASCON_ASSERT(ctx->bufstate.flow_state == ASCON_FLOW_AEAD128_80pq_INITIALISED
                 || ctx->bufstate.flow_state == ASCON_FLOW_AEAD128_80pq_ASSOC_DATA_UPDATED
                 || ctx->bufstate.flow_state == ASCON_FLOW_AEAD128_80pq_ENCRYPT_UPDATED);
    if (ctx->bufstate.flow_state != ASCON_FLOW_AEAD128_80pq_ENCRYPT_UPDATED)
    {
        // Finalise the associated data if not already done sos.
        ascon_aead128_80pq_finalise_assoc_data(ctx);
    }
    size_t freshly_generated_ciphertext_len = 0;
    // If there is any remaining less-than-a-block plaintext to be absorbed
    // cached in the buffer, pad it and absorb it.
    ctx->bufstate.sponge.x0 ^= bigendian_decode_varlen(ctx->bufstate.buffer,
                                                       ctx->bufstate.buffer_len);
    ctx->bufstate.sponge.x0 ^= PADDING(ctx->bufstate.buffer_len);
    // Squeeze out last ciphertext bytes, if any.
    bigendian_encode_varlen(ciphertext, ctx->bufstate.sponge.x0, ctx->bufstate.buffer_len);
    freshly_generated_ciphertext_len += ctx->bufstate.buffer_len;
    // End of encryption, start of tag generation.
    // Apply key twice more with a permutation to set the state for the tag.
    ctx->bufstate.sponge.x1 ^= ctx->k0;
    ctx->bufstate.sponge.x2 ^= ctx->k1;
    ascon_permutation_12(&ctx->bufstate.sponge);
    ctx->bufstate.sponge.x3 ^= ctx->k0;
    ctx->bufstate.sponge.x4 ^= ctx->k1;
    // Squeeze out tag into its buffer.
    ascon_aead_generate_tag(ctx, tag, tag_len);
    // Final security cleanup of the internal state, key and buffer.
    ascon_aead_cleanup(ctx);
    return freshly_generated_ciphertext_len;
}